

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,bool linking)

{
  cmGeneratorTarget *this_00;
  cmListFileBacktrace *this_01;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  reference ppcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  cmListFileBacktrace local_258;
  string local_238;
  string local_218;
  cmListFileBacktrace *local_1f8;
  cmListFileBacktrace *backtrace;
  cmake *cm;
  undefined1 local_1b8 [8];
  ostringstream e;
  MessageType local_3c;
  bool issueMessage;
  cmGeneratorTarget *pcStack_38;
  MessageType messageType;
  cmGeneratorTarget *dependee;
  cmGeneratorTarget *depender;
  bool linking_local;
  cmLinkItem *dependee_name_local;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  this_00 = *ppcVar4;
  pcStack_38 = dependee_name->Target;
  if (((pcStack_38 == (cmGeneratorTarget *)0x0) && (!linking)) &&
     (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 != GLOBAL_TARGET)) {
    local_3c = AUTHOR_WARNING;
    bVar1 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0046(this_00);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&cm,(cmPolicies *)0x2e,id);
        poVar5 = std::operator<<((ostream *)local_1b8,(string *)&cm);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&cm);
        bVar1 = true;
      }
      else if (PVar3 - NEW < 3) {
        bVar1 = true;
        local_3c = FATAL_ERROR;
      }
    }
    if (bVar1) {
      backtrace = (cmListFileBacktrace *)cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
      poVar5 = std::operator<<((ostream *)local_1b8,"The dependency target \"");
      poVar5 = std::operator<<(poVar5,(string *)dependee_name);
      poVar5 = std::operator<<(poVar5,"\" of target \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::operator<<(poVar5,"\" does not exist.");
      local_1f8 = cmGeneratorTarget::GetUtilityBacktrace(this_00,&dependee_name->super_string);
      this_01 = backtrace;
      if (local_1f8 == (cmListFileBacktrace *)0x0) {
        std::__cxx11::ostringstream::str();
        cmListFileBacktrace::cmListFileBacktrace(&local_258);
        cmake::IssueMessage((cmake *)this_01,local_3c,&local_238,&local_258);
        cmListFileBacktrace::~cmListFileBacktrace(&local_258);
        std::__cxx11::string::~string((string *)&local_238);
      }
      else {
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage((cmake *)this_01,local_3c,&local_218,local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  }
  if (((linking) && (pcStack_38 != (cmGeneratorTarget *)0x0)) &&
     ((TVar2 = cmGeneratorTarget::GetType(pcStack_38), TVar2 == EXECUTABLE &&
      (bVar1 = cmGeneratorTarget::IsExecutableWithExports(pcStack_38), !bVar1)))) {
    pcStack_38 = (cmGeneratorTarget *)0x0;
  }
  if (pcStack_38 != (cmGeneratorTarget *)0x0) {
    AddTargetDepend(this,depender_index,pcStack_38,linking);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             cmLinkItem const& dependee_name,
                                             bool linking)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmGeneratorTarget const* dependee = dependee_name.Target;

  if (!dependee && !linking &&
      (depender->GetType() != cmStateEnums::GLOBAL_TARGET)) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (depender->GetPolicyStatusCMP0046()) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" << dependee_name << "\" of target \""
        << depender->GetName() << "\" does not exist.";

      cmListFileBacktrace const* backtrace =
        depender->GetUtilityBacktrace(dependee_name);
      if (backtrace) {
        cm->IssueMessage(messageType, e.str(), *backtrace);
      } else {
        cm->IssueMessage(messageType, e.str());
      }
    }
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (linking && dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = CM_NULLPTR;
  }

  if (dependee) {
    this->AddTargetDepend(depender_index, dependee, linking);
  }
}